

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5StructurePromote(Fts5Index *p,int iLvl,Fts5Structure *pStruct)

{
  uint *puVar1;
  int *piVar2;
  Fts5StructureSegment *pFVar3;
  Fts5StructureSegment *pFVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  Fts5StructureSegment **ppFVar9;
  ulong uVar10;
  int iVar11;
  ulong in_R8;
  int iVar12;
  long local_50;
  
  if (p->rc != 0) {
    return;
  }
  lVar8 = (long)pStruct->aLevel[iLvl].nSeg;
  if (lVar8 != 0) {
    pFVar3 = pStruct->aLevel[iLvl].aSeg;
    iVar6 = (pFVar3[lVar8 + -1].pgnoLast - pFVar3[lVar8 + -1].pgnoFirst) + 1;
    ppFVar9 = &pStruct->aLevel[(uint)iLvl].aSeg;
    iVar7 = iLvl;
    do {
      if (iVar7 < 1) {
        iVar7 = -1;
        iVar11 = 0;
        goto LAB_001d2ffb;
      }
      puVar1 = (uint *)((long)ppFVar9 + -0x14);
      in_R8 = (ulong)*puVar1;
      iVar7 = iVar7 + -1;
      ppFVar9 = ppFVar9 + -2;
    } while (in_R8 == 0);
    iVar11 = 0;
    if (0 < (int)*puVar1) {
      uVar10 = in_R8 * 0xc;
      in_R8 = 0;
      iVar11 = 0;
      do {
        iVar12 = *(int *)((long)&(*ppFVar9)->pgnoLast + in_R8) -
                 *(int *)((long)&(*ppFVar9)->pgnoFirst + in_R8);
        if (iVar11 <= iVar12) {
          iVar11 = iVar12 + 1;
        }
        in_R8 = in_R8 + 0xc;
      } while (uVar10 != in_R8);
    }
    if (iVar11 < iVar6) {
      iVar7 = -1;
      iVar11 = 0;
    }
LAB_001d2ffb:
    if (-1 < iVar7) {
      iLvl = iVar7;
      iVar6 = iVar11;
    }
    if (pStruct->aLevel[iLvl].nMerge == 0) {
      iVar7 = pStruct->nLevel;
      if (iLvl + 1 < iVar7) {
        local_50 = (long)(iLvl + 1);
        while (pStruct->aLevel[local_50].nMerge == 0) {
          lVar8 = (long)pStruct->aLevel[local_50].nSeg;
          if (0 < lVar8) {
            uVar10 = lVar8 + 1;
            lVar8 = lVar8 * 0xc;
            do {
              pFVar3 = pStruct->aLevel[local_50].aSeg;
              if (iVar6 < (*(int *)((long)pFVar3 + lVar8 + -4) - *(int *)((long)pFVar3 + lVar8 + -8)
                          ) + 1) {
                return;
              }
              fts5StructureExtendLevel(&p->rc,pStruct,iLvl,1,(int)in_R8);
              if (p->rc != 0) {
                return;
              }
              pFVar3 = pStruct->aLevel[iLvl].aSeg;
              pFVar4 = pStruct->aLevel[local_50].aSeg;
              pFVar3->pgnoLast = *(int *)(lVar8 + -4 + (long)pFVar4);
              uVar5 = *(undefined8 *)((long)&pFVar4[-1].iSegid + lVar8);
              pFVar3->iSegid = (int)uVar5;
              pFVar3->pgnoFirst = (int)((ulong)uVar5 >> 0x20);
              piVar2 = &pStruct->aLevel[iLvl].nSeg;
              *piVar2 = *piVar2 + 1;
              piVar2 = &pStruct->aLevel[local_50].nSeg;
              *piVar2 = *piVar2 + -1;
              uVar10 = uVar10 - 1;
              lVar8 = lVar8 + -0xc;
            } while (1 < uVar10);
            iVar7 = pStruct->nLevel;
          }
          local_50 = local_50 + 1;
          if (iVar7 <= local_50) {
            return;
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void fts5StructurePromote(
  Fts5Index *p,                   /* FTS5 backend object */
  int iLvl,                       /* Index level just updated */
  Fts5Structure *pStruct          /* Index structure */
){
  if( p->rc==SQLITE_OK ){
    int iTst;
    int iPromote = -1;
    int szPromote = 0;            /* Promote anything this size or smaller */
    Fts5StructureSegment *pSeg;   /* Segment just written */
    int szSeg;                    /* Size of segment just written */
    int nSeg = pStruct->aLevel[iLvl].nSeg;

    if( nSeg==0 ) return;
    pSeg = &pStruct->aLevel[iLvl].aSeg[pStruct->aLevel[iLvl].nSeg-1];
    szSeg = (1 + pSeg->pgnoLast - pSeg->pgnoFirst);

    /* Check for condition (a) */
    for(iTst=iLvl-1; iTst>=0 && pStruct->aLevel[iTst].nSeg==0; iTst--);
    if( iTst>=0 ){
      int i;
      int szMax = 0;
      Fts5StructureLevel *pTst = &pStruct->aLevel[iTst];
      assert( pTst->nMerge==0 );
      for(i=0; i<pTst->nSeg; i++){
        int sz = pTst->aSeg[i].pgnoLast - pTst->aSeg[i].pgnoFirst + 1;
        if( sz>szMax ) szMax = sz;
      }
      if( szMax>=szSeg ){
        /* Condition (a) is true. Promote the newest segment on level 
        ** iLvl to level iTst.  */
        iPromote = iTst;
        szPromote = szMax;
      }
    }

    /* If condition (a) is not met, assume (b) is true. StructurePromoteTo()
    ** is a no-op if it is not.  */
    if( iPromote<0 ){
      iPromote = iLvl;
      szPromote = szSeg;
    }
    fts5StructurePromoteTo(p, iPromote, szPromote, pStruct);
  }
}